

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O0

size_t luaZ_read(ZIO *z,void *b,size_t n)

{
  int iVar1;
  size_t local_38;
  size_t m;
  size_t n_local;
  void *b_local;
  ZIO *z_local;
  
  m = n;
  n_local = (size_t)b;
  while( true ) {
    if (m == 0) {
      return 0;
    }
    iVar1 = checkbuffer(z);
    if (iVar1 == 0) break;
    if (z->n < m) {
      local_38 = z->n;
    }
    else {
      local_38 = m;
    }
    memcpy((void *)n_local,z->p,local_38);
    z->n = z->n - local_38;
    z->p = z->p + local_38;
    n_local = n_local + local_38;
    m = m - local_38;
  }
  return m;
}

Assistant:

size_t luaZ_read (ZIO *z, void *b, size_t n) {
  while (n) {
    size_t m;
    if (!checkbuffer(z))
      return n;  /* no more input; return number of missing bytes */
    m = (n <= z->n) ? n : z->n;  /* min. between n and z->n */
    memcpy(b, z->p, m);
    z->n -= m;
    z->p += m;
    b = (char *)b + m;
    n -= m;
  }
  return 0;
}